

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::CheckArgument(cmCTest *this,string *arg,char *varg1,char *varg2)

{
  bool bVar1;
  
  if ((varg1 != (char *)0x0) && (bVar1 = std::operator==(arg,varg1), bVar1)) {
    return true;
  }
  if (varg2 == (char *)0x0) {
    return false;
  }
  bVar1 = std::operator==(arg,varg2);
  return bVar1;
}

Assistant:

bool cmCTest::CheckArgument(const std::string& arg, const char* varg1,
  const char* varg2)
{
  return (varg1 && arg == varg1) || (varg2 && arg == varg2);
}